

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpoint_set.c
# Opt level: O3

int mpt_fpoint_set(mpt_fpoint *pt,mpt_convertable *src,mpt_range *r)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  mpt_fpoint tmp;
  mpt_iterator *it;
  mpt_fpoint local_28;
  undefined8 local_20;
  
  local_28.x = 0.0;
  local_28.y = 0.0;
  if (src == (mpt_convertable *)0x0) {
    local_28.x = 0.0;
    local_28.y = 0.0;
    iVar1 = 0;
  }
  else {
    local_20 = 0;
    iVar1 = (*src->_vptr->convert)(src,0x86,&local_20);
    if (iVar1 < 0) {
      uVar3 = mpt_fpoint_typeid::ptype;
      iVar2 = mpt_fpoint_typeid::ptype;
      if (mpt_fpoint_typeid::ptype == 0) {
        uVar3 = mpt_type_add(&mpt_fpoint_typeid::traits);
        iVar2 = mpt_fpoint_typeid::ptype;
      }
      mpt_fpoint_typeid::ptype = uVar3;
      if ((mpt_fpoint_typeid::ptype < 1) ||
         (iVar1 = (*src->_vptr->convert)(src,(ulong)(uint)mpt_fpoint_typeid::ptype,&local_28),
         iVar2 = mpt_fpoint_typeid::ptype, iVar1 < 0)) {
        mpt_fpoint_typeid::ptype = iVar2;
        return -3;
      }
    }
    else {
      iVar1 = mpt_iterator_consume(local_20,0x66,&local_28);
      if (iVar1 < 0) {
        return iVar1;
      }
      if (iVar1 == 0) {
        local_28.y = local_28.x;
        iVar1 = 1;
      }
      else {
        iVar2 = mpt_iterator_consume(local_20,0x66,&local_28.y);
        iVar1 = 2;
        if (iVar2 < 0) {
          return iVar2;
        }
      }
    }
    if (r != (mpt_range *)0x0) {
      if ((double)local_28.x < r->min) {
        return -2;
      }
      if ((double)local_28.y < r->min) {
        return -2;
      }
      if (r->max < (double)local_28.x) {
        return -2;
      }
      if (r->max < (double)local_28.y) {
        return -2;
      }
    }
  }
  *pt = local_28;
  return iVar1;
}

Assistant:

extern int mpt_fpoint_set(MPT_STRUCT(fpoint) *pt, MPT_INTERFACE(convertable) *src, const MPT_STRUCT(range) *r)
{
	MPT_INTERFACE(iterator) *it;
	MPT_STRUCT(fpoint) tmp = { 0.0, 0.0 };
	int ret;
	
	if (!src) {
		*pt = tmp;
		return 0;
	}
	it = 0;
	if ((ret = src->_vptr->convert(src, MPT_ENUM(TypeIteratorPtr), &it)) < 0) {
		int type = mpt_fpoint_typeid();
		if (type <= 0 || (ret = src->_vptr->convert(src, type, &tmp)) < 0) {
			return MPT_ERROR(BadType);
		}
	}
	else {
		/* first coordinate */
		if ((ret = mpt_iterator_consume(it, 'f', &tmp.x)) < 0) {
			return ret;
		}
		if (!ret) {
			ret = 1;
			tmp.y = tmp.x;
		}
		else if ((ret = mpt_iterator_consume(it, 'f', &tmp.y)) < 0) {
			return ret;
		}
		else {
			ret = 2;
		}
	}
	if (r) {
		if (tmp.x < r->min || tmp.y < r->min
		 || tmp.x > r->max || tmp.y > r->max) {
			return MPT_ERROR(BadValue);
		}
	}
	*pt = tmp;
	return ret;
}